

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall olc::Sprite::Sprite(Sprite *this,int32_t w,int32_t h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int32_t i;
  int iVar4;
  Pixel *pPVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  
  this->modeSample = NORMAL;
  this->pColData = (Pixel *)0x0;
  this->width = w;
  this->height = h;
  iVar4 = h * w;
  uVar6 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar6 = (long)iVar4 * 4;
  }
  pPVar5 = (Pixel *)operator_new__(uVar6);
  auVar3 = _DAT_00186050;
  auVar2 = _DAT_00186040;
  auVar1 = _DAT_00186030;
  if (iVar4 != 0) {
    uVar8 = (long)iVar4 + 0x3fffffffffffffff;
    uVar6 = uVar8 & 0x3fffffffffffffff;
    auVar9._8_4_ = (int)uVar6;
    auVar9._0_8_ = uVar6;
    auVar9._12_4_ = (int)(uVar6 >> 0x20);
    lVar7 = 0;
    auVar9 = auVar9 ^ _DAT_00186050;
    do {
      auVar10._8_4_ = (int)lVar7;
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar11 = (auVar10 | auVar2) ^ auVar3;
      iVar4 = auVar9._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar4 && auVar9._0_4_ < auVar11._0_4_ || iVar4 < auVar11._4_4_)
                & 1)) {
        pPVar5[lVar7].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        pPVar5[lVar7 + 1].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
      }
      auVar10 = (auVar10 | auVar1) ^ auVar3;
      iVar12 = auVar10._4_4_;
      if (iVar12 <= iVar4 && (iVar12 != iVar4 || auVar10._0_4_ <= auVar9._0_4_)) {
        pPVar5[lVar7 + 2].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
        pPVar5[lVar7 + 3].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
      }
      lVar7 = lVar7 + 4;
    } while ((uVar6 - ((uint)uVar8 & 3)) + 4 != lVar7);
  }
  this->pColData = pPVar5;
  for (lVar7 = 0; lVar7 < h * w; lVar7 = lVar7 + 1) {
    this->pColData[lVar7].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
    w = this->width;
    h = this->height;
  }
  return;
}

Assistant:

Sprite::Sprite(int32_t w, int32_t h)
	{
		if (pColData) delete[] pColData;
		width = w;		height = h;
		pColData = new Pixel[width * height];
		for (int32_t i = 0; i < width * height; i++)
			pColData[i] = Pixel();
	}